

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlOutputter.cpp
# Opt level: O3

void __thiscall CppUnit::XmlOutputter::addStatistics(XmlOutputter *this,XmlElement *rootNode)

{
  int iVar1;
  XmlElement *this_00;
  XmlElement *pXVar2;
  _Map_pointer pppXVar3;
  _Elt_pointer ppXVar4;
  _Elt_pointer ppXVar5;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = (XmlElement *)operator_new(0xe8);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Statistics","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  XmlElement::XmlElement(this_00,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  XmlElement::addElement(rootNode,this_00);
  pXVar2 = (XmlElement *)operator_new(0xe8);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Tests","");
  iVar1 = (*(this->m_result->super_TestSuccessListener).super_TestListener._vptr_TestListener[0xb])
                    ();
  XmlElement::XmlElement(pXVar2,&local_90,iVar1);
  XmlElement::addElement(this_00,pXVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pXVar2 = (XmlElement *)operator_new(0xe8);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"FailuresTotal","");
  iVar1 = (*(this->m_result->super_TestSuccessListener).super_TestListener._vptr_TestListener[0xe])
                    ();
  XmlElement::XmlElement(pXVar2,&local_b0,iVar1);
  XmlElement::addElement(this_00,pXVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  pXVar2 = (XmlElement *)operator_new(0xe8);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Errors","");
  iVar1 = (*(this->m_result->super_TestSuccessListener).super_TestListener._vptr_TestListener[0xc])
                    ();
  XmlElement::XmlElement(pXVar2,&local_d0,iVar1);
  XmlElement::addElement(this_00,pXVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  pXVar2 = (XmlElement *)operator_new(0xe8);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Failures","");
  iVar1 = (*(this->m_result->super_TestSuccessListener).super_TestListener._vptr_TestListener[0xd])
                    ();
  XmlElement::XmlElement(pXVar2,&local_f0,iVar1);
  XmlElement::addElement(this_00,pXVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  ppXVar5 = (this->m_hooks).
            super__Deque_base<CppUnit::XmlOutputterHook_*,_std::allocator<CppUnit::XmlOutputterHook_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (ppXVar5 !=
      (this->m_hooks).
      super__Deque_base<CppUnit::XmlOutputterHook_*,_std::allocator<CppUnit::XmlOutputterHook_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur) {
    ppXVar4 = (this->m_hooks).
              super__Deque_base<CppUnit::XmlOutputterHook_*,_std::allocator<CppUnit::XmlOutputterHook_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last;
    pppXVar3 = (this->m_hooks).
               super__Deque_base<CppUnit::XmlOutputterHook_*,_std::allocator<CppUnit::XmlOutputterHook_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      (*(*ppXVar5)->_vptr_XmlOutputterHook[4])(*ppXVar5,this->m_xml,this_00);
      ppXVar5 = ppXVar5 + 1;
      if (ppXVar5 == ppXVar4) {
        ppXVar5 = pppXVar3[1];
        pppXVar3 = pppXVar3 + 1;
        ppXVar4 = ppXVar5 + 0x40;
      }
    } while (ppXVar5 !=
             (this->m_hooks).
             super__Deque_base<CppUnit::XmlOutputterHook_*,_std::allocator<CppUnit::XmlOutputterHook_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  return;
}

Assistant:

void
XmlOutputter::addStatistics( XmlElement *rootNode )
{
  XmlElement *statisticsElement = new XmlElement( "Statistics" );
  rootNode->addElement( statisticsElement );
  statisticsElement->addElement( new XmlElement( "Tests", m_result->runTests() ) );
  statisticsElement->addElement( new XmlElement( "FailuresTotal", 
                                                 m_result->testFailuresTotal() ) );
  statisticsElement->addElement( new XmlElement( "Errors", m_result->testErrors() ) );
  statisticsElement->addElement( new XmlElement( "Failures", m_result->testFailures() ) );

  for ( Hooks::iterator it = m_hooks.begin(); it != m_hooks.end(); ++it )
    (*it)->statisticsAdded( m_xml, statisticsElement );
}